

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O0

logic_t __thiscall slang::SVInt::operator==(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  __optional_eq_t<unsigned_long,_unsigned_long> value;
  SVInt *in_RSI;
  SVInt *in_RDI;
  optional<unsigned_long> oVar2;
  SVInt *in_stack_00000050;
  SVInt *in_stack_00000058;
  undefined7 in_stack_ffffffffffffffd1;
  undefined1 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  logic_t local_1;
  
  bVar1 = isSingleWord(in_RDI);
  if ((bVar1) && (bVar1 = isSingleWord(in_RSI), bVar1)) {
    oVar2 = as<unsigned_long>((SVInt *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0)
                             );
    oVar2 = as<unsigned_long>((SVInt *)CONCAT71(in_stack_ffffffffffffffe1,
                                                oVar2.
                                                super__Optional_base<unsigned_long,_true,_true>.
                                                _M_payload.
                                                super__Optional_payload_base<unsigned_long>.
                                                _M_engaged));
    value = std::operator==((optional<unsigned_long> *)
                            CONCAT71(in_stack_ffffffffffffffd1,
                                     oVar2.super__Optional_base<unsigned_long,_true,_true>.
                                     _M_payload.super__Optional_payload_base<unsigned_long>.
                                     _M_engaged),
                            (optional<unsigned_long> *)
                            oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._M_payload);
    logic_t::logic_t(&local_1,value);
  }
  else {
    local_1 = equalsSlowCase(in_stack_00000058,in_stack_00000050);
  }
  return (logic_t)local_1.value;
}

Assistant:

logic_t operator==(const SVInt& rhs) const {
        if (isSingleWord() && rhs.isSingleWord())
            return logic_t(as<uint64_t>() == rhs.as<uint64_t>());
        return equalsSlowCase(rhs);
    }